

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GmmGen9ResourceULT.cpp
# Opt level: O3

void __thiscall
CTestGen9Resource_Test3DTileXResource_Test::TestBody
          (CTestGen9Resource_Test3DTileXResource_Test *this)

{
  uint uVar1;
  undefined1 auVar2 [16];
  CTestGen9Resource_Test3DTileXResource_Test *this_00;
  CTestGen9Resource_Test3DTileXResource_Test *this_01;
  GMM_RESOURCE_INFO *pGVar3;
  long lVar4;
  uint *puVar5;
  undefined8 *puVar6;
  undefined4 local_c0;
  undefined4 local_bc;
  undefined8 local_b8;
  undefined8 local_b0;
  undefined1 local_a8 [16];
  undefined1 local_98 [16];
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  undefined5 local_58;
  undefined1 auStack_53 [11];
  undefined8 local_48;
  CTestGen9Resource_Test3DTileXResource_Test *local_40;
  ulong local_38;
  
  local_68 = (undefined1  [16])0x0;
  local_78 = (undefined1  [16])0x0;
  local_88 = (undefined1  [16])0x0;
  local_98 = (undefined1  [16])0x0;
  local_a8 = (undefined1  [16])0x0;
  local_48 = 0;
  local_c0 = 3;
  auStack_53 = SUB1611((undefined1  [16])0x0,5);
  local_58 = 0x100000000;
  local_b0 = 0x800000000;
  local_b8 = 0x400000000;
  lVar4 = 0;
  do {
    local_bc = *(undefined4 *)((long)&DAT_001a7ffc + lVar4);
    local_98._8_8_ = 1;
    local_88._0_8_ = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c0);
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,0x200);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,1);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x1000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,8);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar4 = lVar4 + 4;
  } while ((int)lVar4 != 0x14);
  puVar5 = (uint *)&DAT_001a7394;
  lVar4 = 0;
  local_40 = this;
  do {
    local_bc = *(undefined4 *)((long)&DAT_001a7ffc + lVar4);
    uVar1 = puVar5[-1];
    local_38 = (ulong)*puVar5;
    local_98._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar4) + 1;
    local_98._12_4_ = 0;
    local_88._0_8_ = 0x100000001;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar4));
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this,pGVar3,0x2000);
    CTestResource::VerifyResourceQPitch<true>((CTestResource *)this,pGVar3,local_38);
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    this_00 = local_40;
    lVar4 = lVar4 + 4;
    puVar5 = puVar5 + 3;
  } while (lVar4 != 0x14);
  puVar5 = (uint *)&DAT_001a7394;
  lVar4 = 0;
  do {
    local_bc = *(undefined4 *)((long)&DAT_001a7ffc + lVar4);
    uVar1 = puVar5[-1];
    local_38 = (ulong)*puVar5;
    local_98._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar4) + 1;
    local_98._12_4_ = 0;
    local_88._4_4_ = 1;
    local_88._0_4_ = *puVar5 + 1;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar4));
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this_00,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this_00,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_00,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_00,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this_00,pGVar3,0x4000);
    CTestResource::VerifyResourceQPitch<true>
              ((CTestResource *)this_00,pGVar3,(ulong)(uint)((int)local_38 * 2));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    this_01 = local_40;
    lVar4 = lVar4 + 4;
    puVar5 = puVar5 + 3;
  } while (lVar4 != 0x14);
  puVar6 = &DAT_001a7394;
  lVar4 = 0;
  do {
    auVar2 = local_88;
    local_bc = *(undefined4 *)((long)&DAT_001a7ffc + lVar4);
    uVar1 = *(uint *)((long)puVar6 + -4);
    local_98._8_4_ = uVar1 / *(uint *)((long)&DAT_001a7fe8 + lVar4) + 1;
    local_98._12_4_ = 0;
    local_38 = *puVar6;
    local_88._4_4_ = (int)(local_38 >> 0x20) + 1;
    local_88._0_4_ = (int)local_38 + 1;
    local_88._8_8_ = auVar2._8_8_;
    pGVar3 = (GMM_RESOURCE_INFO *)
             (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0xe8))
                       (CommonULT::pGmmULTClientContext,&local_c0,
                        (ulong)uVar1 % (ulong)*(uint *)((long)&DAT_001a7fe8 + lVar4));
    CTestResource::VerifyResourceHAlign<true>((CTestResource *)this_01,pGVar3,0x10);
    CTestResource::VerifyResourceVAlign<true>((CTestResource *)this_01,pGVar3,4);
    CTestResource::VerifyResourcePitch<true>((CTestResource *)this_01,pGVar3,uVar1 * 2);
    CTestResource::VerifyResourcePitchInTiles<true>((CTestResource *)this_01,pGVar3,2);
    CTestResource::VerifyResourceSize<true>((CTestResource *)this_01,pGVar3,0x8000);
    CTestResource::VerifyResourceQPitch<true>
              ((CTestResource *)this_01,pGVar3,(ulong)(uint)((int)local_38 * 2));
    (**(code **)(*(long *)CommonULT::pGmmULTClientContext + 0x100))
              (CommonULT::pGmmULTClientContext,pGVar3);
    lVar4 = lVar4 + 4;
    puVar6 = (undefined8 *)((long)puVar6 + 0xc);
  } while (lVar4 != 0x14);
  return;
}

Assistant:

TEST_F(CTestGen9Resource, Test3DTileXResource)
{
    // Horizontal/Vertical pixel alignment
    const uint32_t HAlign                    = 16;
    const uint32_t VAlign                    = 4;
    const uint32_t TileSize[TEST_BPP_MAX][3] = {{512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1},
                                                {512, 8, 1}};

    GMM_RESCREATE_PARAMS gmmParams = {};
    gmmParams.Type                 = RESOURCE_3D;
    gmmParams.NoGfxMemory          = 1;
    gmmParams.Flags.Info.TiledX    = 1;
    gmmParams.Flags.Gpu.Texture    = 1;

    // Allocate 1x1x1 surface
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = 0x1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 1);
        VerifyResourceSize<true>(ResourceInfo, GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = 0x1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = 0x1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }

    // Allocate 2 tiles in X/Y/Z dimension
    for(uint32_t i = 0; i < TEST_BPP_MAX; i++)
    {
        TEST_BPP bpp          = static_cast<TEST_BPP>(i);
        gmmParams.Format      = SetResourceFormat(bpp);
        gmmParams.BaseWidth64 = (TileSize[i][0] / GetBppValue(bpp)) + 1;
        gmmParams.BaseHeight  = TileSize[i][1] + 1;
        gmmParams.Depth       = TileSize[i][2] + 1;

        GMM_RESOURCE_INFO *ResourceInfo;
        ResourceInfo = pGmmULTClientContext->CreateResInfoObject(&gmmParams);

        VerifyResourceHAlign<true>(ResourceInfo, HAlign);
        VerifyResourceVAlign<true>(ResourceInfo, VAlign);
        VerifyResourcePitch<true>(ResourceInfo, 2 * TileSize[i][0]);
        VerifyResourcePitchInTiles<true>(ResourceInfo, 2);
        VerifyResourceSize<true>(ResourceInfo, 2 * 2 * 2 * GMM_KBYTE(4));
        VerifyResourceQPitch<true>(ResourceInfo, 2 * TileSize[i][1]);

        pGmmULTClientContext->DestroyResInfoObject(ResourceInfo);
    }
}